

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GlobalVar *var)

{
  bool bVar1;
  string *name;
  Name<3> local_20;
  GlobalVar *local_18;
  GlobalVar *var_local;
  CWriter *this_local;
  
  local_18 = var;
  var_local = (GlobalVar *)this;
  bVar1 = Var::is_name(var->var);
  if (!bVar1) {
    __assert_fail("var.var.is_name()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/c-writer.cc"
                  ,0x2d2,"void wabt::(anonymous namespace)::CWriter::Write(const GlobalVar &)");
  }
  name = Var::name_abi_cxx11_(local_18->var);
  Name<3>::Name(&local_20,name);
  Write(this,&local_20);
  return;
}

Assistant:

void CWriter::Write(const GlobalVar& var) {
  assert(var.var.is_name());
  Write(ExternalRef(var.var.name()));
}